

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall
BufferedReader::BufferedReader
          (BufferedReader *this,uint32_t blockSize,uint32_t allocSize,uint32_t prereadThreshold)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  
  (this->super_AbstractReader).m_blockSize = 0;
  (this->super_AbstractReader).m_allocSize = 0;
  (this->super_AbstractReader).m_prereadThreshold = 0;
  (this->super_TerminatableThread).m_thread._M_id._M_thread = 0;
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_0024a108;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_0024a198;
  this->m_started = false;
  this->m_terminated = false;
  WaitableSafeQueue<int>::WaitableSafeQueue(&this->m_readQueue,0x1000);
  std::condition_variable::condition_variable(&this->m_readCond);
  *(undefined8 *)((long)&(this->m_readersMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readersMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_readersMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_readersMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_readersMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_readMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0
  ;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__next + 4) = 0
  ;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractReader).m_blockSize = blockSize;
  if (allocSize == 0) {
    allocSize = blockSize;
  }
  (this->super_AbstractReader).m_allocSize = allocSize;
  uVar2 = blockSize >> 1;
  if (prereadThreshold != 0) {
    uVar2 = prereadThreshold;
  }
  (this->super_AbstractReader).m_prereadThreshold = uVar2;
  return;
}

Assistant:

BufferedReader::BufferedReader(const uint32_t blockSize, const uint32_t allocSize, const uint32_t prereadThreshold)
    : m_started(false), m_terminated(false), m_readQueue(QUEUE_MAX_SIZE), m_id(0)
{
    // size of the blocks being read
    m_blockSize = blockSize;
    // size of the memory reserved per-block (can exceed the block size, in which case the rest of the memory can be
    // used by the user)
    m_allocSize = allocSize ? allocSize : blockSize;
    // data preread threshold
    m_prereadThreshold = prereadThreshold ? prereadThreshold : m_blockSize / 2;
}